

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

int __thiscall
H264StreamReader::writeAdditionData
          (H264StreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,AVPacket *avPacket,
          PriorityDataInfo *priorityData)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *puVar4;
  NALUnit *pNVar5;
  pointer puVar6;
  long lVar7;
  int iVar8;
  ostream *poVar9;
  iterator iVar10;
  _Rb_tree_node_base *p_Var11;
  undefined4 *puVar12;
  byte bVar13;
  uint32_t uVar14;
  uint8_t *puVar15;
  uint8_t *dstBuffer_00;
  uint *local_270;
  undefined8 local_268;
  uint local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  uint *local_250;
  undefined8 local_248;
  uint local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  uint *local_230;
  undefined8 local_228;
  uint local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  uint *local_210;
  undefined8 local_208;
  uint local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  uint *local_1f0;
  undefined8 local_1e8;
  uint local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  ostringstream ss;
  undefined1 local_160 [16];
  uint32_t local_150;
  uint32_t local_14c;
  int local_148;
  undefined8 local_48;
  int local_40;
  uint8_t *local_38;
  
  uVar2 = avPacket->size;
  dstBuffer_00 = dstBuffer;
  if ((long)(ulong)uVar2 < (long)dstEnd - (long)dstBuffer && 4 < (int)uVar2) {
    puVar4 = avPacket->data;
    bVar13 = puVar4[4] & 0x1f;
    if ((bVar13 == 0x18) || (bVar13 == 9)) {
      this->m_delimiterFound = true;
      memcpy(dstBuffer,puVar4,(ulong)uVar2);
      iVar8 = avPacket->size;
      avPacket->size = 0;
      dstBuffer_00 = dstBuffer + iVar8;
      avPacket->data = (uint8_t *)0x0;
    }
  }
  if ((this->m_delimiterFound == false) && (this->m_lastSliceSPS != 0xffffffff)) {
    if (this->m_firstAUDWarn == true) {
      this->m_firstAUDWarn = false;
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "H264 bitstream changed: insert nal unit delimiters");
      std::endl<char,std::char_traits<char>>(poVar9);
      sLastMsg = true;
    }
    if ((long)dstEnd - (long)dstBuffer_00 < 6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::operator<<((ostream *)&ss,"H264 stream error: Not enough buffer for write headers");
      puVar12 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar12 = 3;
      *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
      if (local_1f0 == &local_1e0) {
        puVar12[6] = local_1e0;
        puVar12[7] = uStack_1dc;
        puVar12[8] = uStack_1d8;
        puVar12[9] = uStack_1d4;
      }
      else {
        *(uint **)(puVar12 + 2) = local_1f0;
        *(ulong *)(puVar12 + 6) = CONCAT44(uStack_1dc,local_1e0);
      }
      *(undefined8 *)(puVar12 + 4) = local_1e8;
      local_1e8 = 0;
      local_1e0 = local_1e0 & 0xffffff00;
      local_1f0 = &local_1e0;
      __cxa_throw(puVar12,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    if ((this->super_MPEGStreamReader).m_shortStartCodes == false) {
      *dstBuffer_00 = '\0';
      dstBuffer_00 = dstBuffer_00 + 1;
    }
    dstBuffer_00[0] = '\0';
    dstBuffer_00[1] = '\0';
    dstBuffer_00[2] = '\x01';
    if ((this->m_mvcSubStream == true) && (this->m_blurayMode == true)) {
      dstBuffer_00[3] = '\x18';
      dstBuffer_00 = dstBuffer_00 + 4;
    }
    else {
      dstBuffer_00[3] = '\t';
      dstBuffer_00[4] = (char)this->m_pict_type << 5 | 0x10;
      dstBuffer_00 = dstBuffer_00 + 5;
    }
  }
  uVar14 = this->m_lastSliceSPS;
  uVar2 = avPacket->flags;
  if (this->m_h264SPSCont == true) {
    if (((1 < this->m_spsCounter) ||
        (uVar3 = (this->super_MPEGStreamReader).m_totalFrameNum, (int)uVar3 < 2)) ||
       ((bVar13 = 1, this->m_lastSliceIDR == false &&
        ((uVar3 < 0xfb || (this->m_lastIFrame == false)))))) {
      bVar13 = (uVar2 & 0x20) == 0 & this->m_firstFileFrame;
    }
  }
  else {
    bVar13 = 0;
  }
  bVar1 = this->m_needSeiCorrection;
  if ((((this->m_lastIFrame == true) && (uVar14 != 0xffffffff)) &&
      (this->m_lastSlicePPS != 0xffffffff)) &&
     (((byte)((uVar2 & 0x20) >> 5) & bVar1) != 0 || bVar13 != 0)) {
    avPacket->flags = uVar2 | 0x20;
    if (((this->m_firstSPSWarn == true) && (0xfa < (this->super_MPEGStreamReader).m_totalFrameNum))
       && (this->m_firstSPSWarn = false, bVar13 != 0)) {
      poVar9 = std::operator<<((ostream *)&std::cout,"H264 bitstream changed: insert SPS/PPS units")
      ;
      std::endl<char,std::char_traits<char>>(poVar9);
      sLastMsg = true;
    }
    iVar10 = std::
             _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SPSUnit_*>,_std::_Select1st<std::pair<const_unsigned_int,_SPSUnit_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
             ::find(&(this->m_spsMap)._M_t,&this->m_lastSliceSPS);
    if ((long)dstEnd - (long)dstBuffer_00 < 4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::operator<<((ostream *)&ss,"H264 stream error: Not enough buffer for write headers");
      puVar12 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar12 = 3;
      *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
      if (local_210 == &local_200) {
        puVar12[6] = local_200;
        puVar12[7] = uStack_1fc;
        puVar12[8] = uStack_1f8;
        puVar12[9] = uStack_1f4;
      }
      else {
        *(uint **)(puVar12 + 2) = local_210;
        *(ulong *)(puVar12 + 6) = CONCAT44(uStack_1fc,local_200);
      }
      *(undefined8 *)(puVar12 + 4) = local_208;
      local_208 = 0;
      local_200 = local_200 & 0xffffff00;
      local_210 = &local_200;
      __cxa_throw(puVar12,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    pNVar5 = (NALUnit *)iVar10._M_node[1]._M_parent;
    if ((this->super_MPEGStreamReader).m_shortStartCodes == false) {
      *dstBuffer_00 = '\0';
      dstBuffer_00 = dstBuffer_00 + 1;
    }
    dstBuffer_00[0] = '\0';
    dstBuffer_00[1] = '\0';
    dstBuffer_00[2] = '\x01';
    iVar8 = NALUnit::serializeBuffer(pNVar5,dstBuffer_00 + 3,dstEnd,false);
    if (iVar8 == -1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::operator<<((ostream *)&ss,"H264 stream error: Not enough buffer for write headers");
      puVar12 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar12 = 3;
      *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
      if (local_230 == &local_220) {
        puVar12[6] = local_220;
        puVar12[7] = uStack_21c;
        puVar12[8] = uStack_218;
        puVar12[9] = uStack_214;
      }
      else {
        *(uint **)(puVar12 + 2) = local_230;
        *(ulong *)(puVar12 + 6) = CONCAT44(uStack_21c,local_220);
      }
      *(undefined8 *)(puVar12 + 4) = local_228;
      local_228 = 0;
      local_220 = local_220 & 0xffffff00;
      local_230 = &local_220;
      __cxa_throw(puVar12,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    dstBuffer_00 = dstBuffer_00 + 3 + iVar8;
    for (p_Var11 = (this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var11 != &(this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      if ((long)dstEnd - (long)dstBuffer_00 < 4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        std::operator<<((ostream *)&ss,"H264 stream error: Not enough buffer for write headers");
        puVar12 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar12 = 3;
        *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
        if (local_250 == &local_240) {
          puVar12[6] = local_240;
          puVar12[7] = uStack_23c;
          puVar12[8] = uStack_238;
          puVar12[9] = uStack_234;
        }
        else {
          *(uint **)(puVar12 + 2) = local_250;
          *(ulong *)(puVar12 + 6) = CONCAT44(uStack_23c,local_240);
        }
        *(undefined8 *)(puVar12 + 4) = local_248;
        local_248 = 0;
        local_240 = local_240 & 0xffffff00;
        local_250 = &local_240;
        __cxa_throw(puVar12,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      pNVar5 = (NALUnit *)p_Var11[1]._M_parent;
      if ((this->super_MPEGStreamReader).m_shortStartCodes == false) {
        *dstBuffer_00 = '\0';
        dstBuffer_00 = dstBuffer_00 + 1;
      }
      dstBuffer_00[0] = '\0';
      dstBuffer_00[1] = '\0';
      dstBuffer_00[2] = '\x01';
      iVar8 = NALUnit::serializeBuffer(pNVar5,dstBuffer_00 + 3,dstEnd,false);
      if (iVar8 == -1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        std::operator<<((ostream *)&ss,"H264 stream error: Not enough buffer for write headers");
        puVar12 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar12 = 3;
        *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
        if (local_270 == &local_260) {
          puVar12[6] = local_260;
          puVar12[7] = uStack_25c;
          puVar12[8] = uStack_258;
          puVar12[9] = uStack_254;
        }
        else {
          *(uint **)(puVar12 + 2) = local_270;
          *(ulong *)(puVar12 + 6) = CONCAT44(uStack_25c,local_260);
        }
        *(undefined8 *)(puVar12 + 4) = local_268;
        local_260 = local_260 & 0xffffff00;
        __cxa_throw(puVar12,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      dstBuffer_00 = dstBuffer_00 + 3 + iVar8;
    }
  }
  if ((bVar1 & uVar14 != 0xffffffff) != 0) {
    if (this->m_firstSEIWarn == true) {
      this->m_firstSEIWarn = false;
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "H264 bitstream changed: insert pict timing and buffering period SEI units"
                              );
      std::endl<char,std::char_traits<char>>(poVar9);
      sLastMsg = true;
    }
    if (this->m_lastIFrame == true) {
      if (this->m_lastSliceIDR == true) {
        _ss = &PTR__SEIUnit_0024a4f0;
        memset(local_160,0,0x118);
        local_48._0_4_ = -1;
        local_48._4_4_ = 0;
        local_40 = 0;
        local_38 = (uint8_t *)0x0;
        local_148 = 0xd0bd8;
        iVar8 = writeSEIMessage(this,dstBuffer_00,dstEnd,(SEIUnit *)&ss,'\0');
        dstBuffer_00 = dstBuffer_00 + iVar8;
        SEIUnit::~SEIUnit((SEIUnit *)&ss);
      }
      if ((this->m_mvcSubStream == true) &&
         (puVar4 = (this->m_bdRomMetaDataMsg).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
         puVar4 != (this->m_bdRomMetaDataMsg).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish)) {
        SEIUnit::updateMetadataPts
                  (puVar4 + this->m_bdRomMetaDataMsgPtsPos,
                   (this->super_MPEGStreamReader).m_curDts / 0xe5b0 + this->m_startPts);
        puVar15 = dstBuffer_00;
        if ((this->super_MPEGStreamReader).m_shortStartCodes == false) {
          puVar15 = dstBuffer_00 + 1;
          *dstBuffer_00 = '\0';
        }
        puVar15[0] = '\0';
        puVar15[1] = '\0';
        puVar15[2] = '\x01';
        iVar8 = NALUnit::encodeNAL(puVar4,puVar4 + ((long)(this->m_bdRomMetaDataMsg).
                                                                                                                    
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->m_bdRomMetaDataMsg).
                                                                                                                
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                                   puVar15 + 3,(long)dstEnd - (long)(puVar15 + 3));
        puVar15 = puVar15 + (long)iVar8 + 3;
        if (priorityData != (PriorityDataInfo *)0x0) {
          _ss = (int)dstBuffer_00 - (int)dstBuffer;
          register0x000000ac = (int)puVar15 - (int)dstBuffer_00;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<std::pair<int,int>>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)priorityData,
                     (pair<int,_int> *)&ss);
        }
        puVar6 = (this->m_bdRomMetaDataMsg).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dstBuffer_00 = puVar15;
        if ((this->m_bdRomMetaDataMsg).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar6) {
          (this->m_bdRomMetaDataMsg).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar6;
        }
      }
    }
    _ss = &PTR__SEIUnit_0024a4f0;
    memset(local_160,0,0x118);
    local_48._0_4_ = -1;
    local_48._4_4_ = 0;
    local_40 = 0;
    local_38 = (uint8_t *)0x0;
    local_150 = this->m_removalDelay;
    lVar7 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
    local_14c = (uint32_t)
                (((this->m_frameDepth * lVar7 +
                  ((this->super_MPEGStreamReader).m_curPts - (this->super_MPEGStreamReader).m_curDts
                  )) * 2) / lVar7);
    uVar14 = local_150;
    if (this->m_lastSliceIDR == true) {
      this->m_removalDelay = 0;
      uVar14 = 0;
    }
    this->m_removalDelay = uVar14 + 2;
    iVar8 = writeSEIMessage(this,dstBuffer_00,dstEnd,(SEIUnit *)&ss,'\x01');
    dstBuffer_00 = dstBuffer_00 + iVar8;
    SEIUnit::~SEIUnit((SEIUnit *)&ss);
  }
  this->m_firstFileFrame = false;
  return (int)dstBuffer_00 - (int)dstBuffer;
}

Assistant:

int H264StreamReader::writeAdditionData(uint8_t *dstBuffer, uint8_t *dstEnd, AVPacket &avPacket,
                                        PriorityDataInfo *priorityData)
{
    uint8_t *curPos = dstBuffer;
    if (avPacket.size > 4 && avPacket.size < dstEnd - dstBuffer)
    {
        auto nalType = static_cast<NALUnit::NALType>(avPacket.data[4] & 0x1f);
        if (nalType == NALUnit::NALType::nuDelimiter || nalType == NALUnit::NALType::nuDRD)
        {
            // place delimiter at first place
            m_delimiterFound = true;
            memcpy(curPos, avPacket.data, avPacket.size);
            curPos += avPacket.size;
            avPacket.size = 0;
            avPacket.data = nullptr;
        }
    }

    if (!m_delimiterFound && m_lastSliceSPS != UINT_MAX)
    {
        if (m_firstAUDWarn)
        {
            m_firstAUDWarn = false;
            LTRACE(LT_INFO, 2, "H264 bitstream changed: insert nal unit delimiters");
        }
        if (dstEnd - curPos < 6)
            THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
        curPos = writeNalPrefix(curPos);
        if (m_mvcSubStream && m_blurayMode)
        {
            *curPos++ = static_cast<uint8_t>(NALUnit::NALType::nuDRD);
        }
        else
        {
            *curPos++ = static_cast<uint8_t>(NALUnit::NALType::nuDelimiter);
            *curPos++ = static_cast<uint8_t>(m_pict_type << 5 | 0x10);  // primary_pic_type << 5 + rbsp bits
        }
    }

    bool needInsTimingSEI = m_needSeiCorrection && m_lastSliceSPS != UINT_MAX;
    bool srcSpsPpsFound = avPacket.flags & AVPacket::IS_SPS_PPS_IN_GOP;
    bool spsDiscontinue =
        m_h264SPSCont &&
        ((m_spsCounter < 2 && ((m_totalFrameNum > 1 && m_lastSliceIDR) || (m_totalFrameNum > 250 && isIFrame()))) ||
         (m_firstFileFrame && !srcSpsPpsFound));
    bool needInsSpsPps = false;
    if (isIFrame() && m_lastSliceSPS != UINT_MAX && m_lastSlicePPS != UINT_MAX)
    {
        needInsSpsPps = spsDiscontinue || (replaceToOwnSPS() && srcSpsPpsFound);
    }

    if (needInsSpsPps)
    {
        avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

        // Why the check for 250 : unless we see the 2nd IDR frame, we can only see that the stream runs with open GOPs
        // (open GOPs with one IDR at start for the whole movie do happen). That's why there's also a check that there's
        // a SPS before for the first I-frame in the first GOP in a normal stream. There's nothing scary about that - we
        // simply insert one more SPS - but in order to avoid outputting messages into the console, I left the check at
        // 250.
        if (m_firstSPSWarn && m_totalFrameNum > 250)
        {
            m_firstSPSWarn = false;
            if (spsDiscontinue)
            {
                LTRACE(LT_INFO, 2, "H264 bitstream changed: insert SPS/PPS units");
            }
        }
        SPSUnit *sps = m_spsMap.find(m_lastSliceSPS)->second;
        if (dstEnd - curPos < 4)
            THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
        curPos = writeNalPrefix(curPos);
        int sRez = sps->serializeBuffer(curPos, dstEnd, false);
        if (sRez == -1)
            THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
        curPos += sRez;

        // PPSUnit* pps = m_ppsMap.find(m_lastSlicePPS)->second;
        // curPos = writeNalPrefix(curPos);
        // curPos += pps->serializeBuffer(curPos, false);
        for (auto [index, pps] : m_ppsMap)
        {
            if (dstEnd - curPos < 4)
                THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
            curPos = writeNalPrefix(curPos);
            sRez = pps->serializeBuffer(curPos, dstEnd, false);
            if (sRez == -1)
                THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
            curPos += sRez;
        }
    }

    if (needInsTimingSEI)
    {
        if (m_firstSEIWarn)
        {
            m_firstSEIWarn = false;
            LTRACE(LT_INFO, 2, "H264 bitstream changed: insert pict timing and buffering period SEI units");
        }

        if (m_lastIFrame)
        {
            if (m_lastSliceIDR)
            {
                SEIUnit sei;
                sei.initial_cpb_removal_delay[0] = 855000;
                sei.initial_cpb_removal_delay_offset[0] = 0;
                curPos += writeSEIMessage(curPos, dstEnd, sei, SEI_MSG_BUFFERING_PERIOD);
            }

            if (m_mvcSubStream)
            {
                if (!m_bdRomMetaDataMsg.empty())
                {
                    // we got slice. fill previous metadata SEI message
                    auto pts90k = m_curDts / INT_FREQ_TO_TS_FREQ + m_startPts;
                    uint8_t *srcData = m_bdRomMetaDataMsg.data();
                    SEIUnit::updateMetadataPts(srcData + m_bdRomMetaDataMsgPtsPos, pts90k);

                    uint8_t *prevPos = curPos;
                    curPos = writeNalPrefix(curPos);
                    curPos += NALUnit::encodeNAL(srcData, srcData + m_bdRomMetaDataMsg.size(), curPos, dstEnd - curPos);
                    if (priorityData)
                        priorityData->push_back(std::make_pair<int, int>(static_cast<int>(prevPos - dstBuffer),
                                                                         static_cast<int>(curPos - prevPos)));
                    m_bdRomMetaDataMsg.clear();
                }
            }
        }

        SEIUnit sei;
        sei.cpb_removal_delay = m_removalDelay;
        sei.dpb_output_delay =
            static_cast<int>(((m_curPts - m_curDts + m_pcrIncPerFrame * getFrameDepth()) * 2) / m_pcrIncPerFrame);
        sei.pic_struct = m_lastPictStruct;

        if (m_lastSliceIDR)
            m_removalDelay = 0;
        m_removalDelay += 2;
        curPos += writeSEIMessage(curPos, dstEnd, sei, SEI_MSG_PIC_TIMING);
    }
    m_firstFileFrame = false;
    return static_cast<int>(curPos - dstBuffer);
}